

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::B3DImporter::ReadMESH(B3DImporter *this)

{
  pointer pVVar1;
  pointer pVVar2;
  int iVar3;
  pointer puVar4;
  uint uVar5;
  string t;
  string local_50;
  
  ReadInt(this);
  if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] != this->_pos) {
    pVVar1 = (this->_vertices).
             super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (this->_vertices).
             super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ReadChunk_abi_cxx11_(&local_50,this);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar3 == 0) {
        ReadVRTS(this);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar3 == 0) {
          ReadTRIS(this,(int)((ulong)((long)pVVar1 - (long)pVVar2) >> 3) * -0x49249249);
        }
      }
      puVar4 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar5 = puVar4[-1];
      puVar4 = puVar4 + -1;
      this->_pos = uVar5;
      (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        puVar4 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar5 = this->_pos;
      }
    } while (puVar4[-1] != uVar5);
  }
  return;
}

Assistant:

void B3DImporter::ReadMESH(){
    /*int matid=*/ReadInt();

    int v0= static_cast<int>(_vertices.size());

    while( ChunkSize() ){
        string t=ReadChunk();
        if( t=="VRTS" ){
            ReadVRTS();
        }else if( t=="TRIS" ){
            ReadTRIS( v0 );
        }
        ExitChunk();
    }
}